

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O0

TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader> * __thiscall
ASDCP::MXF::TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>::InitInfo
          (TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader> *this)

{
  int iVar1;
  byte_t *pbVar2;
  long in_RSI;
  CryptographicContext local_1e0 [104];
  Result_t local_178 [8];
  Result_t cr_result;
  SourcePackage *SP;
  Identification local_90 [111];
  undefined1 local_21;
  WriterInfo *local_20;
  InterchangeObject *Object;
  TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader> *this_local;
  Result_t *result;
  
  this_local = this;
  if (*(long *)(in_RSI + 8) == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                  ,0x11b,
                  "Result_t ASDCP::MXF::TrackFileReader<ASDCP::MXF::OP1aHeader, AS_02::MXF::AS02IndexReader>::InitInfo() [HeaderType = ASDCP::MXF::OP1aHeader, IndexAccessType = AS_02::MXF::AS02IndexReader]"
                 );
  }
  local_21 = 0;
  ASDCP::Dictionary::Type((MDD_t)*(undefined8 *)(in_RSI + 8));
  ASDCP::MXF::OP1aHeader::GetMDObjectByType((uchar *)this,(InterchangeObject **)(in_RSI + 0x18));
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    ASDCP::MD_to_WriterInfo(local_90,local_20);
    Kumu::Result_t::~Result_t((Result_t *)local_90);
    ASDCP::Dictionary::Type((MDD_t)*(undefined8 *)(in_RSI + 8));
    ASDCP::MXF::OP1aHeader::GetMDObjectByType((uchar *)&SP,(InterchangeObject **)(in_RSI + 0x18));
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&SP);
    Kumu::Result_t::~Result_t((Result_t *)&SP);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    pbVar2 = Kumu::Identifier<32U>::Value
                       ((Identifier<32U> *)((long)&(local_20->ProductName).field_2 + 8));
    *(undefined8 *)(in_RSI + 0x430) = *(undefined8 *)(pbVar2 + 0x10);
    *(undefined8 *)(in_RSI + 0x438) = *(undefined8 *)(pbVar2 + 0x18);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    ASDCP::Dictionary::Type((MDD_t)*(undefined8 *)(in_RSI + 8));
    ASDCP::MXF::OP1aHeader::GetMDObjectByType
              ((uchar *)local_178,(InterchangeObject **)(in_RSI + 0x18));
    iVar1 = Kumu::Result_t::operator_cast_to_int(local_178);
    if (-1 < iVar1) {
      ASDCP::MD_to_CryptoInfo(local_1e0,local_20,(Dictionary *)(in_RSI + 0x420));
      Kumu::Result_t::~Result_t((Result_t *)local_1e0);
    }
    Kumu::Result_t::~Result_t(local_178);
  }
  return this;
}

Assistant:

Result_t InitInfo()
	{
	  assert(m_Dict);
	  InterchangeObject* Object;

	  // Identification
	  Result_t result = m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(Identification), &Object);

	  // Writer Info and SourcePackage
	  if ( KM_SUCCESS(result) )
	    {
	      MD_to_WriterInfo((Identification*)Object, m_Info);
	      result = m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(SourcePackage), &Object);
	    }

	  if ( KM_SUCCESS(result) )
	    {
	      SourcePackage* SP = (SourcePackage*)Object;
	      memcpy(m_Info.AssetUUID, SP->PackageUID.Value() + 16, UUIDlen);
	    }

	  // optional CryptographicContext
	  if ( KM_SUCCESS(result) )
	    {
	      Result_t cr_result = m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(CryptographicContext), &Object);

	      if ( KM_SUCCESS(cr_result) )
		MD_to_CryptoInfo((CryptographicContext*)Object, m_Info, *m_Dict);
	    }

	  return result;
	}